

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * string_get_sortable_timestamp_abi_cxx11_(void)

{
  long lVar1;
  tm *__tp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_fd;
  allocator<char> local_fc;
  char timestamp_ns [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  time_t as_time_t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char timestamp_no_ns [100];
  
  lVar1 = std::chrono::_V2::system_clock::now();
  as_time_t = lVar1 / 1000000000;
  __tp = localtime(&as_time_t);
  strftime(timestamp_no_ns,100,"%Y_%m_%d-%H_%M_%S",__tp);
  snprintf(timestamp_ns,0xb,"%09ld",lVar1 % 1000000000);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,timestamp_no_ns,&local_fc);
  std::operator+(&local_d0,&local_a8,".");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,timestamp_ns,&local_fd);
  std::operator+(in_RDI,&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_a8);
  return in_RDI;
}

Assistant:

std::string string_get_sortable_timestamp() {
    using clock = std::chrono::system_clock;

    const clock::time_point current_time = clock::now();
    const time_t as_time_t = clock::to_time_t(current_time);
    char timestamp_no_ns[100];
    std::strftime(timestamp_no_ns, 100, "%Y_%m_%d-%H_%M_%S", std::localtime(&as_time_t));

    const int64_t ns = std::chrono::duration_cast<std::chrono::nanoseconds>(
        current_time.time_since_epoch() % 1000000000).count();
    char timestamp_ns[11];
    snprintf(timestamp_ns, 11, "%09" PRId64, ns);

    return std::string(timestamp_no_ns) + "." + std::string(timestamp_ns);
}